

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O0

vector<Expr_*,_std::allocator<Expr_*>_> *
generatePhiAssignments(Block *blockEnding,Block *nextBlock)

{
  undefined1 uVar1;
  PHINode *args;
  Expr *args_1;
  long *in_RSI;
  vector<Expr_*,_std::allocator<Expr_*>_> *in_RDI;
  Expr *incoming;
  uint i;
  Expr *phiVar;
  PHINode *phi;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  __end1;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  __begin1;
  iterator_range<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>_>
  *__range1;
  Program *program;
  vector<Expr_*,_std::allocator<Expr_*>_> *exprs;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  Expr *in_stack_ffffffffffffff00;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  *in_stack_ffffffffffffff10;
  BasicBlock *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff40;
  uint local_74;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  local_58 [3];
  iterator_range<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>_>
  local_40;
  iterator_range<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>_>
  *local_30;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  *local_28;
  undefined1 local_19;
  long *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::vector<Expr_*,_std::allocator<Expr_*>_>::vector
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)0x2941d9);
  local_28 = *(phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
               **)(local_10[1] + 0x10);
  local_40 = llvm::BasicBlock::phis((BasicBlock *)in_stack_ffffffffffffff00);
  local_30 = &local_40;
  local_58[0] = llvm::
                iterator_range<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>_>
                ::begin(local_30);
  llvm::
  iterator_range<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>_>
  ::end(local_30);
  while( true ) {
    uVar1 = llvm::
            iterator_facade_base<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>,_std::forward_iterator_tag,_const_llvm::PHINode,_long,_const_llvm::PHINode_*,_const_llvm::PHINode_&>
            ::operator!=((iterator_facade_base<llvm::BasicBlock::phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>,_std::forward_iterator_tag,_const_llvm::PHINode,_long,_const_llvm::PHINode_*,_const_llvm::PHINode_&>
                          *)in_stack_ffffffffffffff00,
                         (phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
                          *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!(bool)uVar1) break;
    args = llvm::BasicBlock::
           phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
           ::operator*(local_58);
    args_1 = Program::getExpr((Program *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (Value *)in_stack_ffffffffffffff20);
    local_74 = 0;
    while( true ) {
      in_stack_ffffffffffffff28 = local_74;
      in_stack_ffffffffffffff2c = llvm::PHINode::getNumIncomingValues((PHINode *)0x29430e);
      if (in_stack_ffffffffffffff2c <= in_stack_ffffffffffffff28) break;
      in_stack_ffffffffffffff20 =
           llvm::PHINode::getIncomingBlock
                     ((PHINode *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if (in_stack_ffffffffffffff20 == (BasicBlock *)*local_10) {
        in_stack_ffffffffffffff10 = local_28;
        llvm::PHINode::getIncomingValue
                  ((PHINode *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        Program::getExpr((Program *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (Value *)in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff00 =
             Program::makeExpr<AssignExpr,Expr*&,Expr*&>
                       ((Program *)CONCAT17(uVar1,in_stack_ffffffffffffff40),(Expr **)args,
                        (Expr **)args_1);
        std::vector<Expr_*,_std::allocator<Expr_*>_>::push_back
                  ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff00,
                   (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
      local_74 = local_74 + 1;
    }
    llvm::BasicBlock::
    phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
    ::operator++(in_stack_ffffffffffffff10);
  }
  return in_RDI;
}

Assistant:

static std::vector<Expr*> generatePhiAssignments(Block* blockEnding, Block* nextBlock) {
    std::vector<Expr*> exprs;

    Program& program = *blockEnding->func->program;

    for (const auto& phi : nextBlock->block->phis()) {
        Expr* phiVar = program.getExpr(&phi);

        // see if nextBlock declares any incoming value from blockEnding
        for (unsigned i = 0; i < phi.getNumIncomingValues(); ++i) {
            if (phi.getIncomingBlock(i) == blockEnding->block) {
                Expr* incoming = program.getExpr(phi.getIncomingValue(i));
                exprs.push_back(program.makeExpr<AssignExpr>(phiVar, incoming));
            }
        }
    }

    return exprs;
}